

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,TypeAliasType *type,string_view overrideName)

{
  bool bVar1;
  Type *pTVar2;
  Scope *this_00;
  Scope *scope;
  undefined1 local_48 [8];
  string path;
  TypeAliasType *type_local;
  TypePrinter *this_local;
  string_view overrideName_local;
  
  overrideName_local._M_len = (size_t)overrideName._M_str;
  this_local = (TypePrinter *)overrideName._M_len;
  path.field_2._8_8_ = type;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    if (((this->options).elideScopeNames & 1U) == 0) {
      this_00 = Symbol::getParentScope((Symbol *)path.field_2._8_8_);
      getLexicalPath_abi_cxx11_((string *)local_48,(ast *)this_00,scope);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)local_48,
                 (basic_string_view<char,_std::char_traits<char>_> *)(path.field_2._8_8_ + 8));
      pTVar2 = DeclaredType::getType((DeclaredType *)(path.field_2._8_8_ + 0x48));
      Symbol::visit<slang::ast::TypePrinter&,std::__cxx11::string&>
                (&pTVar2->super_Symbol,this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      pTVar2 = DeclaredType::getType((DeclaredType *)(path.field_2._8_8_ + 0x48));
      Symbol::
      visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>const&>
                (&pTVar2->super_Symbol,this,
                 (basic_string_view<char,_std::char_traits<char>_> *)(path.field_2._8_8_ + 8));
    }
  }
  else {
    pTVar2 = DeclaredType::getType((DeclaredType *)(path.field_2._8_8_ + 0x48));
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>&>
              (&pTVar2->super_Symbol,this,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  return;
}

Assistant:

void TypePrinter::visit(const TypeAliasType& type, string_view overrideName) {
    if (!overrideName.empty()) {
        type.targetType.getType().visit(*this, overrideName);
    }
    else if (options.elideScopeNames) {
        type.targetType.getType().visit(*this, type.name);
    }
    else {
        std::string path = getLexicalPath(type.getParentScope());
        path.append(type.name);
        type.targetType.getType().visit(*this, path);
    }
}